

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O0

long ov_read_filter(OggVorbis_File *vf,char *buffer,int length,int bigendianp,int word,int sgned,
                   int *bitstream,_func_void_float_ptr_ptr_long_long_void_ptr *filter,
                   void *filter_param)

{
  long lVar1;
  char cVar2;
  int iVar3;
  vorbis_info *pvVar4;
  char *pcVar5;
  int local_9c;
  short *psStack_98;
  int val_1;
  short *dest_1;
  float *src_1;
  short *dest;
  float *src;
  int off_1;
  int off;
  int val;
  vorbis_fpu_control fpu;
  long bytespersample;
  long channels;
  long lStack_50;
  int ret;
  long samples;
  float **pcm;
  int hs;
  int host_endian;
  int j;
  int i;
  int sgned_local;
  int word_local;
  int bigendianp_local;
  int length_local;
  char *buffer_local;
  OggVorbis_File *vf_local;
  
  j = sgned;
  i = word;
  sgned_local = bigendianp;
  word_local = length;
  _bigendianp_local = buffer;
  buffer_local = (char *)vf;
  pcm._4_4_ = host_is_big_endian();
  if (*(int *)(buffer_local + 0x80) < 2) {
    vf_local = (OggVorbis_File *)0xffffffffffffff7d;
  }
  else if (i < 1) {
    vf_local = (OggVorbis_File *)0xffffffffffffff7d;
  }
  else {
    do {
      if (*(int *)(buffer_local + 0x80) == 4) {
        iVar3 = vorbis_synthesis_pcmout
                          ((vorbis_dsp_state *)(buffer_local + 0x240),(float ***)&samples);
        lStack_50 = (long)iVar3;
        if (lStack_50 != 0) {
          if (lStack_50 < 1) {
            return lStack_50;
          }
          pvVar4 = ov_info((OggVorbis_File *)buffer_local,-1);
          bytespersample = (long)pvVar4->channels;
          _val = i * bytespersample;
          if ((0 < bytespersample) && (bytespersample < 0x100)) {
            if ((long)word_local / _val < lStack_50) {
              lStack_50 = (long)word_local / _val;
            }
            if (lStack_50 < 1) {
              return -0x83;
            }
            if (filter != (_func_void_float_ptr_ptr_long_long_void_ptr *)0x0) {
              (*filter)((float **)samples,bytespersample,lStack_50,filter_param);
            }
            if (i == 1) {
              cVar2 = -0x80;
              if (j != 0) {
                cVar2 = '\0';
              }
              vorbis_fpu_setround((vorbis_fpu_control *)((long)&off + 2));
              for (hs = 0; hs < lStack_50; hs = hs + 1) {
                for (host_endian = 0; host_endian < bytespersample; host_endian = host_endian + 1) {
                  off_1 = vorbis_ftoi((double)(*(float *)(*(long *)(samples + (long)host_endian * 8)
                                                         + (long)hs * 4) * 128.0));
                  if (off_1 < 0x80) {
                    if (off_1 < -0x80) {
                      off_1 = -0x80;
                    }
                  }
                  else {
                    off_1._0_1_ = '\x7f';
                  }
                  *_bigendianp_local = (char)off_1 + cVar2;
                  _bigendianp_local = _bigendianp_local + 1;
                }
              }
              vorbis_fpu_restore(off._2_2_);
            }
            else {
              iVar3 = 0x8000;
              if (j != 0) {
                iVar3 = 0;
              }
              if (pcm._4_4_ == sgned_local) {
                if (j == 0) {
                  vorbis_fpu_setround((vorbis_fpu_control *)((long)&off + 2));
                  for (host_endian = 0; host_endian < bytespersample; host_endian = host_endian + 1)
                  {
                    lVar1 = *(long *)(samples + (long)host_endian * 8);
                    psStack_98 = (short *)(_bigendianp_local + (long)host_endian * 2);
                    for (hs = 0; hs < lStack_50; hs = hs + 1) {
                      off_1 = vorbis_ftoi((double)(*(float *)(lVar1 + (long)hs * 4) * 32768.0));
                      if (off_1 < 0x8000) {
                        if (off_1 < -0x8000) {
                          off_1 = -0x8000;
                        }
                      }
                      else {
                        off_1._0_2_ = 0x7fff;
                      }
                      *psStack_98 = (short)off_1 + (short)iVar3;
                      psStack_98 = psStack_98 + bytespersample;
                    }
                  }
                  vorbis_fpu_restore(off._2_2_);
                }
                else {
                  vorbis_fpu_setround((vorbis_fpu_control *)((long)&off + 2));
                  for (host_endian = 0; host_endian < bytespersample; host_endian = host_endian + 1)
                  {
                    lVar1 = *(long *)(samples + (long)host_endian * 8);
                    src_1 = (float *)(_bigendianp_local + (long)host_endian * 2);
                    for (hs = 0; hs < lStack_50; hs = hs + 1) {
                      off_1 = vorbis_ftoi((double)(*(float *)(lVar1 + (long)hs * 4) * 32768.0));
                      if (off_1 < 0x8000) {
                        if (off_1 < -0x8000) {
                          off_1 = -0x8000;
                        }
                      }
                      else {
                        off_1._0_2_ = 0x7fff;
                      }
                      *(short *)src_1 = (short)off_1;
                      src_1 = (float *)(bytespersample * 2 + (long)src_1);
                    }
                  }
                  vorbis_fpu_restore(off._2_2_);
                }
              }
              else if (sgned_local == 0) {
                vorbis_fpu_setround((vorbis_fpu_control *)((long)&off + 2));
                for (hs = 0; hs < lStack_50; hs = hs + 1) {
                  for (host_endian = 0; host_endian < bytespersample; host_endian = host_endian + 1)
                  {
                    local_9c = vorbis_ftoi((double)(*(float *)(*(long *)(samples +
                                                                        (long)host_endian * 8) +
                                                              (long)hs * 4) * 32768.0));
                    if (local_9c < 0x8000) {
                      if (local_9c < -0x8000) {
                        local_9c = -0x8000;
                      }
                    }
                    else {
                      local_9c = 0x7fff;
                    }
                    pcVar5 = _bigendianp_local + 1;
                    *_bigendianp_local = (char)(iVar3 + local_9c);
                    _bigendianp_local = _bigendianp_local + 2;
                    *pcVar5 = (char)((uint)(iVar3 + local_9c) >> 8);
                  }
                }
                vorbis_fpu_restore(off._2_2_);
              }
              else {
                vorbis_fpu_setround((vorbis_fpu_control *)((long)&off + 2));
                for (hs = 0; hs < lStack_50; hs = hs + 1) {
                  for (host_endian = 0; host_endian < bytespersample; host_endian = host_endian + 1)
                  {
                    off_1 = vorbis_ftoi((double)(*(float *)(*(long *)(samples +
                                                                     (long)host_endian * 8) +
                                                           (long)hs * 4) * 32768.0));
                    if (off_1 < 0x8000) {
                      if (off_1 < -0x8000) {
                        off_1 = -0x8000;
                      }
                    }
                    else {
                      off_1 = 0x7fff;
                    }
                    pcVar5 = _bigendianp_local + 1;
                    *_bigendianp_local = (char)((uint)(iVar3 + off_1) >> 8);
                    _bigendianp_local = _bigendianp_local + 2;
                    *pcVar5 = (char)(iVar3 + off_1);
                  }
                }
                vorbis_fpu_restore(off._2_2_);
              }
            }
            vorbis_synthesis_read((vorbis_dsp_state *)(buffer_local + 0x240),(int)lStack_50);
            iVar3 = vorbis_synthesis_halfrate_p(*(vorbis_info **)(buffer_local + 0x68));
            *(long *)(buffer_local + 0x78) =
                 (lStack_50 << ((byte)iVar3 & 0x3f)) + *(long *)(buffer_local + 0x78);
            if (bitstream != (int *)0x0) {
              *bitstream = *(int *)(buffer_local + 0x90);
            }
            return lStack_50 * _val;
          }
          return -0x83;
        }
        lStack_50 = 0;
      }
      channels._4_4_ =
           _fetch_and_process_packet((OggVorbis_File *)buffer_local,(ogg_packet *)0x0,1,1);
      if (channels._4_4_ == -2) {
        return 0;
      }
    } while (0 < channels._4_4_);
    vf_local = (OggVorbis_File *)(long)channels._4_4_;
  }
  return (long)vf_local;
}

Assistant:

long ov_read_filter(OggVorbis_File *vf,char *buffer,int length,
                    int bigendianp,int word,int sgned,int *bitstream,
                    void (*filter)(float **pcm,long channels,long samples,void *filter_param),void *filter_param){
  int i,j;
  int host_endian = host_is_big_endian();
  int hs;

  float **pcm;
  long samples;

  if(vf->ready_state<OPENED)return(OV_EINVAL);
  if(word<=0)return(OV_EINVAL);

  while(1){
    if(vf->ready_state==INITSET){
      samples=vorbis_synthesis_pcmout(&vf->vd,&pcm);
      if(samples)break;
    }

    /* suck in another packet */
    {
      int ret=_fetch_and_process_packet(vf,NULL,1,1);
      if(ret==OV_EOF)
        return(0);
      if(ret<=0)
        return(ret);
    }

  }

  if(samples>0){

    /* yay! proceed to pack data into the byte buffer */

    long channels=ov_info(vf,-1)->channels;
    long bytespersample=word * channels;
    vorbis_fpu_control fpu;

    if(channels<1||channels>255)return(OV_EINVAL);
    if(samples>length/bytespersample)samples=length/bytespersample;

    if(samples <= 0)
      return OV_EINVAL;

    /* Here. */
    if(filter)
      filter(pcm,channels,samples,filter_param);

    /* a tight loop to pack each size */
    {
      int val;
      if(word==1){
        int off=(sgned?0:128);
        vorbis_fpu_setround(&fpu);
        for(j=0;j<samples;j++)
          for(i=0;i<channels;i++){
            val=vorbis_ftoi(pcm[i][j]*128.f);
            if(val>127)val=127;
            else if(val<-128)val=-128;
            *buffer++=val+off;
          }
        vorbis_fpu_restore(fpu);
      }else{
        int off=(sgned?0:32768);

        if(host_endian==bigendianp){
          if(sgned){

            vorbis_fpu_setround(&fpu);
            for(i=0;i<channels;i++) { /* It's faster in this order */
              float *src=pcm[i];
              short *dest=((short *)buffer)+i;
              for(j=0;j<samples;j++) {
                val=vorbis_ftoi(src[j]*32768.f);
                if(val>32767)val=32767;
                else if(val<-32768)val=-32768;
                *dest=val;
                dest+=channels;
              }
            }
            vorbis_fpu_restore(fpu);

          }else{

            vorbis_fpu_setround(&fpu);
            for(i=0;i<channels;i++) {
              float *src=pcm[i];
              short *dest=((short *)buffer)+i;
              for(j=0;j<samples;j++) {
                val=vorbis_ftoi(src[j]*32768.f);
                if(val>32767)val=32767;
                else if(val<-32768)val=-32768;
                *dest=val+off;
                dest+=channels;
              }
            }
            vorbis_fpu_restore(fpu);

          }
        }else if(bigendianp){

          vorbis_fpu_setround(&fpu);
          for(j=0;j<samples;j++)
            for(i=0;i<channels;i++){
              val=vorbis_ftoi(pcm[i][j]*32768.f);
              if(val>32767)val=32767;
              else if(val<-32768)val=-32768;
              val+=off;
              *buffer++=(val>>8);
              *buffer++=(val&0xff);
            }
          vorbis_fpu_restore(fpu);

        }else{
          int val;
          vorbis_fpu_setround(&fpu);
          for(j=0;j<samples;j++)
            for(i=0;i<channels;i++){
              val=vorbis_ftoi(pcm[i][j]*32768.f);
              if(val>32767)val=32767;
              else if(val<-32768)val=-32768;
              val+=off;
              *buffer++=(val&0xff);
              *buffer++=(val>>8);
                  }
          vorbis_fpu_restore(fpu);

        }
      }
    }

    vorbis_synthesis_read(&vf->vd,samples);
    hs=vorbis_synthesis_halfrate_p(vf->vi);
    vf->pcm_offset+=(samples<<hs);
    if(bitstream)*bitstream=vf->current_link;
    return(samples*bytespersample);
  }else{
    return(samples);
  }
}